

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

byte_vec_t * __thiscall
sfc::Map::snes_mode7_interleaved_data(byte_vec_t *__return_storage_ptr__,Map *this,Tileset *tileset)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  allocator_type local_41;
  byte_vec_t tile_data;
  byte_vec_t map_data;
  
  native_data(&map_data,this,false,0,0);
  Tileset::native_data(&tile_data,tileset);
  uVar3 = (long)map_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)map_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((ulong)((long)map_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)map_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) <
      (ulong)((long)tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start)) {
    uVar3 = (long)tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,uVar3 * 2,&local_41);
  uVar1 = 0;
  uVar2 = 0;
  while( true ) {
    if ((ulong)((long)map_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)map_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) <= (ulong)uVar2) break;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[uVar1] =
         map_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2];
    uVar2 = uVar2 + 1;
    uVar1 = uVar1 + 2;
  }
  uVar2 = 0;
  uVar1 = 1;
  while( true ) {
    if ((ulong)((long)tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) <= (ulong)uVar2) break;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[uVar1] =
         tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2];
    uVar2 = uVar2 + 1;
    uVar1 = uVar1 + 2;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&tile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&map_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

byte_vec_t Map::snes_mode7_interleaved_data(const Tileset& tileset) const {
  auto map_data = native_data();
  auto tile_data = tileset.native_data();

  size_t sz = (tile_data.size() > map_data.size()) ? tile_data.size() : map_data.size();
  byte_vec_t data = byte_vec_t(sz * 2);
  for (unsigned i = 0; i < map_data.size(); ++i)
    data[(i << 1)] = map_data[i];
  for (unsigned i = 0; i < tile_data.size(); ++i)
    data[(i << 1) + 1] = tile_data[i];

  return data;
}